

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

ExtensionRange * __thiscall
google::protobuf::Descriptor::FindExtensionRangeContainingNumber(Descriptor *this,int number)

{
  int iVar1;
  ExtensionRange *pEVar2;
  int local_20;
  int i;
  int number_local;
  Descriptor *this_local;
  
  local_20 = 0;
  while( true ) {
    iVar1 = extension_range_count(this);
    if (iVar1 <= local_20) {
      return (ExtensionRange *)0x0;
    }
    pEVar2 = extension_range(this,local_20);
    if ((pEVar2->start <= number) && (pEVar2 = extension_range(this,local_20), number < pEVar2->end)
       ) break;
    local_20 = local_20 + 1;
  }
  pEVar2 = extension_range(this,local_20);
  return pEVar2;
}

Assistant:

const Descriptor::ExtensionRange*
Descriptor::FindExtensionRangeContainingNumber(int number) const {
  // Linear search should be fine because we don't expect a message to have
  // more than a couple extension ranges.
  for (int i = 0; i < extension_range_count(); i++) {
    if (number >= extension_range(i)->start &&
        number < extension_range(i)->end) {
      return extension_range(i);
    }
  }
  return nullptr;
}